

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_workspace.cpp
# Opt level: O2

FILE * __thiscall ON_Workspace::OpenFile(ON_Workspace *this,char *sFileName,char *sMode)

{
  FILE *pFVar1;
  ON_Workspace_FBLK *pOVar2;
  
  pFVar1 = ON::OpenFile(sFileName,sMode);
  if (pFVar1 != (FILE *)0x0) {
    pOVar2 = (ON_Workspace_FBLK *)GetMemory(this,0x10);
    pOVar2->pNext = this->m_pFileBlk;
    pOVar2->pFile = pFVar1;
    this->m_pFileBlk = pOVar2;
  }
  return pFVar1;
}

Assistant:

FILE* ON_Workspace::OpenFile( const char* sFileName, const char* sMode ) 
{
  FILE* pFile = ON::OpenFile( sFileName, sMode );
  if ( pFile ) 
  {
    struct ON_Workspace_FBLK* pFileBlk = (struct ON_Workspace_FBLK*)GetMemory( sizeof(*pFileBlk) );
    pFileBlk->pNext = m_pFileBlk;
    pFileBlk->pFile = pFile;
    m_pFileBlk = pFileBlk;
  }
  return pFile;
}